

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O2

uint32_t * FastPForLib::__fastunpack4_8(uint32_t *in,uint32_t *out)

{
  uint32_t uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  
  uVar1 = *in;
  auVar6._4_4_ = uVar1;
  auVar6._0_4_ = uVar1;
  auVar6._8_4_ = uVar1;
  auVar6._12_4_ = uVar1;
  auVar7._16_4_ = uVar1;
  auVar7._0_16_ = auVar6;
  auVar7._20_4_ = uVar1;
  auVar7._24_4_ = uVar1;
  auVar7._28_4_ = uVar1;
  auVar2 = vpsrlvd_avx2(auVar6,_DAT_001948a0);
  auVar3 = vpsrlvd_avx2(auVar6,_DAT_001a07c0);
  auVar5 = valignd_avx512vl(ZEXT1632(auVar2),ZEXT1632(auVar2),7);
  auVar8._0_16_ = ZEXT116(0) * auVar3 + ZEXT116(1) * auVar6;
  auVar8._16_16_ = ZEXT116(0) * auVar7._16_16_ + ZEXT116(1) * auVar3;
  auVar5 = vpblendd_avx2(auVar5,auVar7,1);
  auVar7 = vpsrld_avx2(auVar7,0x1c);
  auVar5 = vpblendd_avx2(auVar5,auVar8,0x60);
  auVar4._8_4_ = 0xf;
  auVar4._0_8_ = 0xf0000000f;
  auVar4._12_4_ = 0xf;
  auVar4._16_4_ = 0xf;
  auVar4._20_4_ = 0xf;
  auVar4._24_4_ = 0xf;
  auVar4._28_4_ = 0xf;
  auVar5 = vpandd_avx512vl(auVar5,auVar4);
  auVar5 = vpblendd_avx2(auVar5,auVar7,0x80);
  *(undefined1 (*) [32])out = auVar5;
  return in + 1;
}

Assistant:

const uint32_t *__fastunpack4_8(const uint32_t *__restrict__ in,
                                uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 4);
  out++;
  *out = ((*in) >> 4) % (1U << 4);
  out++;
  *out = ((*in) >> 8) % (1U << 4);
  out++;
  *out = ((*in) >> 12) % (1U << 4);
  out++;
  *out = ((*in) >> 16) % (1U << 4);
  out++;
  *out = ((*in) >> 20) % (1U << 4);
  out++;
  *out = ((*in) >> 24) % (1U << 4);
  out++;
  *out = ((*in) >> 28);
  ++in;
  out++;

  return in;
}